

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O0

void embree::SceneGraph::optimize_animation(Ref<embree::SceneGraph::Node> *node)

{
  Node *pNVar1;
  bool bVar2;
  reference pRVar3;
  reference pvVar4;
  reference pvVar5;
  size_t sVar6;
  reference pvVar7;
  reference pvVar8;
  long *in_RDI;
  size_t i_4;
  bool equal_4;
  Ref<embree::SceneGraph::SubdivMeshNode> mesh_4;
  size_t i_3;
  bool equal_3;
  Ref<embree::SceneGraph::PointSetNode> mesh_3;
  size_t i_2;
  bool equal_2;
  Ref<embree::SceneGraph::HairSetNode> mesh_2;
  size_t i_1;
  bool equal_1;
  Ref<embree::SceneGraph::QuadMeshNode> mesh_1;
  size_t i;
  bool equal;
  Ref<embree::SceneGraph::TriangleMeshNode> mesh;
  Ref<embree::SceneGraph::Node> *child;
  iterator __end3;
  iterator __begin3;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *__range3;
  Ref<embree::SceneGraph::GroupNode> groupNode;
  Ref<embree::SceneGraph::TransformNode> xfmNode;
  vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
  *in_stack_fffffffffffff9d8;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  *in_stack_fffffffffffff9e0;
  size_type in_stack_fffffffffffff9f8;
  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
  *in_stack_fffffffffffffa00;
  long *local_560;
  long *local_500;
  long *local_4a0;
  long *local_440;
  long *local_3e0;
  long *local_3a0;
  Ref<embree::SceneGraph::Node> *local_360;
  size_type local_348;
  bool local_339;
  ulong local_330;
  bool local_321;
  ulong local_318;
  bool local_309;
  ulong local_300;
  bool local_2f1;
  ulong local_2e8;
  bool local_2d9;
  __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
  local_2b8;
  long *local_2b0;
  long *local_2a8;
  Node *local_2a0;
  
  if (*in_RDI == 0) {
    local_360 = (Ref<embree::SceneGraph::Node> *)0x0;
  }
  else {
    local_360 = (Ref<embree::SceneGraph::Node> *)
                __dynamic_cast(*in_RDI,&Node::typeinfo,&TransformNode::typeinfo,0);
  }
  if (local_360 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (**(code **)&local_360->ptr->fileName)();
  }
  if (local_360 == (Ref<embree::SceneGraph::Node> *)0x0) {
    if (*in_RDI == 0) {
      local_3a0 = (long *)0x0;
    }
    else {
      local_3a0 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&GroupNode::typeinfo,0);
    }
    local_2a8 = local_3a0;
    if (local_3a0 != (long *)0x0) {
      (**(code **)(*local_3a0 + 0x10))();
    }
    if (local_2a8 == (long *)0x0) {
      if (*in_RDI == 0) {
        local_3e0 = (long *)0x0;
      }
      else {
        local_3e0 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&TriangleMeshNode::typeinfo,0);
      }
      if (local_3e0 == (long *)0x0) {
        if (*in_RDI == 0) {
          local_440 = (long *)0x0;
        }
        else {
          local_440 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&QuadMeshNode::typeinfo,0);
        }
        if (local_440 == (long *)0x0) {
          if (*in_RDI == 0) {
            local_4a0 = (long *)0x0;
          }
          else {
            local_4a0 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&HairSetNode::typeinfo,0);
          }
          if (local_4a0 == (long *)0x0) {
            if (*in_RDI == 0) {
              local_500 = (long *)0x0;
            }
            else {
              local_500 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&PointSetNode::typeinfo,0);
            }
            if (local_500 == (long *)0x0) {
              if (*in_RDI == 0) {
                local_560 = (long *)0x0;
              }
              else {
                local_560 = (long *)__dynamic_cast(*in_RDI,&Node::typeinfo,&SubdivMeshNode::typeinfo
                                                   ,0);
              }
              if (local_560 != (long *)0x0) {
                (**(code **)(*local_560 + 0x10))();
                local_339 = true;
                for (local_348 = 1; sVar6 = SubdivMeshNode::numTimeSteps((SubdivMeshNode *)0x1c693c)
                    , local_348 < sVar6; local_348 = local_348 + 1) {
                  pvVar7 = std::
                           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                         *)(local_560 + 0xe),0);
                  pvVar8 = std::
                           vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                         *)(local_560 + 0xe),local_348);
                  bVar2 = embree::operator==(pvVar7,pvVar8);
                  local_339 = (local_339 & bVar2) != 0;
                }
                if (local_339 != false) {
                  std::
                  vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ::resize(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
                }
              }
              if (local_560 != (long *)0x0) {
                (**(code **)(*local_560 + 0x18))();
              }
            }
            else {
              (**(code **)(*local_500 + 0x10))();
              local_321 = true;
              for (local_330 = 1; sVar6 = PointSetNode::numTimeSteps((PointSetNode *)0x1c6688),
                  local_330 < sVar6; local_330 = local_330 + 1) {
                pvVar4 = std::
                         vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                         ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                       *)(local_500 + 0xf),0);
                pvVar5 = std::
                         vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                         ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                       *)(local_500 + 0xf),local_330);
                bVar2 = embree::operator==(pvVar4,pvVar5);
                local_321 = (local_321 & bVar2) != 0;
              }
              if (local_321 != false) {
                std::
                vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                          *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
              }
            }
            if (local_500 != (long *)0x0) {
              (**(code **)(*local_500 + 0x18))();
            }
          }
          else {
            (**(code **)(*local_4a0 + 0x10))();
            local_309 = true;
            for (local_318 = 1; sVar6 = HairSetNode::numTimeSteps((HairSetNode *)0x1c63d4),
                local_318 < sVar6; local_318 = local_318 + 1) {
              pvVar4 = std::
                       vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                     *)(local_4a0 + 0xf),0);
              pvVar5 = std::
                       vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                       ::operator[]((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                                     *)(local_4a0 + 0xf),local_318);
              bVar2 = embree::operator==(pvVar4,pvVar5);
              local_309 = (local_309 & bVar2) != 0;
            }
            if (local_309 != false) {
              std::
              vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
              ::resize((vector<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
                        *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
            }
          }
          if (local_4a0 != (long *)0x0) {
            (**(code **)(*local_4a0 + 0x18))();
          }
        }
        else {
          (**(code **)(*local_440 + 0x10))();
          local_2f1 = true;
          for (local_300 = 1; sVar6 = QuadMeshNode::numTimeSteps((QuadMeshNode *)0x1c6120),
              local_300 < sVar6; local_300 = local_300 + 1) {
            pvVar7 = std::
                     vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   *)(local_440 + 0xe),0);
            pvVar8 = std::
                     vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                     ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   *)(local_440 + 0xe),local_300);
            bVar2 = embree::operator==(pvVar7,pvVar8);
            local_2f1 = (local_2f1 & bVar2) != 0;
          }
          if (local_2f1 != false) {
            std::
            vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
            ::resize(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
          }
        }
        if (local_440 != (long *)0x0) {
          (**(code **)(*local_440 + 0x18))();
        }
      }
      else {
        (**(code **)(*local_3e0 + 0x10))();
        local_2d9 = true;
        for (local_2e8 = 1; sVar6 = TriangleMeshNode::numTimeSteps((TriangleMeshNode *)0x1c5e6c),
            local_2e8 < sVar6; local_2e8 = local_2e8 + 1) {
          pvVar7 = std::
                   vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                 *)(local_3e0 + 0xe),0);
          pvVar8 = std::
                   vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                   ::operator[]((vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                 *)(local_3e0 + 0xe),local_2e8);
          bVar2 = embree::operator==(pvVar7,pvVar8);
          local_2d9 = (local_2d9 & bVar2) != 0;
        }
        if (local_2d9 != false) {
          std::
          vector<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
          ::resize(in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8);
        }
      }
      if (local_3e0 != (long *)0x0) {
        (**(code **)(*local_3e0 + 0x18))();
      }
    }
    else {
      local_2b0 = local_2a8 + 0xd;
      local_2b8._M_current =
           (Ref<embree::SceneGraph::Node> *)
           std::
           vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
           ::begin(in_stack_fffffffffffff9d8);
      std::
      vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>
      ::end(in_stack_fffffffffffff9d8);
      while (bVar2 = __gnu_cxx::operator!=
                               (in_stack_fffffffffffff9e0,
                                (__normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                                 *)in_stack_fffffffffffff9d8), bVar2) {
        pRVar3 = __gnu_cxx::
                 __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
                 ::operator*(&local_2b8);
        pNVar1 = pRVar3->ptr;
        if (pNVar1 != (Node *)0x0) {
          (*(pNVar1->super_RefCount)._vptr_RefCount[2])();
        }
        optimize_animation(local_360);
        if (pNVar1 != (Node *)0x0) {
          (*(pNVar1->super_RefCount)._vptr_RefCount[3])();
        }
        __gnu_cxx::
        __normal_iterator<embree::Ref<embree::SceneGraph::Node>_*,_std::vector<embree::Ref<embree::SceneGraph::Node>,_std::allocator<embree::Ref<embree::SceneGraph::Node>_>_>_>
        ::operator++(&local_2b8);
      }
    }
    if (local_2a8 != (long *)0x0) {
      (**(code **)(*local_2a8 + 0x18))();
    }
  }
  else {
    local_2a0 = local_360[0x13].ptr;
    if (local_2a0 != (Node *)0x0) {
      (*(local_2a0->super_RefCount)._vptr_RefCount[2])();
    }
    optimize_animation(local_360);
    if (local_2a0 != (Node *)0x0) {
      (*(local_2a0->super_RefCount)._vptr_RefCount[3])();
    }
  }
  if (local_360 != (Ref<embree::SceneGraph::Node> *)0x0) {
    (*(code *)(local_360->ptr->fileName)._M_string_length)();
  }
  return;
}

Assistant:

void SceneGraph::optimize_animation(Ref<SceneGraph::Node> node)
  {
    if (Ref<SceneGraph::TransformNode> xfmNode = node.dynamicCast<SceneGraph::TransformNode>()) 
      optimize_animation(xfmNode->child);

    else if (Ref<SceneGraph::GroupNode> groupNode = node.dynamicCast<SceneGraph::GroupNode>()) 
    {
      for (const auto& child : groupNode->children) 
        optimize_animation(child);
    }
    else if (Ref<SceneGraph::TriangleMeshNode> mesh = node.dynamicCast<SceneGraph::TriangleMeshNode>()) 
    {
      bool equal = true;
      for (size_t i=1; i<mesh->numTimeSteps(); i++)
        equal &= mesh->positions[0] == mesh->positions[i];

      if (equal)
        mesh->positions.resize(1);
    }
    else if (Ref<SceneGraph::QuadMeshNode> mesh = node.dynamicCast<SceneGraph::QuadMeshNode>()) 
    {
      bool equal = true;
      for (size_t i=1; i<mesh->numTimeSteps(); i++)
        equal &= mesh->positions[0] == mesh->positions[i];

      if (equal)
        mesh->positions.resize(1);
    }
    else if (Ref<SceneGraph::HairSetNode> mesh = node.dynamicCast<SceneGraph::HairSetNode>()) 
    {
      bool equal = true;
      for (size_t i=1; i<mesh->numTimeSteps(); i++)
        equal &= mesh->positions[0] == mesh->positions[i];

      if (equal)
        mesh->positions.resize(1);
    }
    else if (Ref<SceneGraph::PointSetNode> mesh = node.dynamicCast<SceneGraph::PointSetNode>())
    {
      bool equal = true;
      for (size_t i=1; i<mesh->numTimeSteps(); i++)
        equal &= mesh->positions[0] == mesh->positions[i];

      if (equal)
        mesh->positions.resize(1);
    }
    else if (Ref<SceneGraph::SubdivMeshNode> mesh = node.dynamicCast<SceneGraph::SubdivMeshNode>())
    {
      bool equal = true;
      for (size_t i=1; i<mesh->numTimeSteps(); i++)
        equal &= mesh->positions[0] == mesh->positions[i];

      if (equal)
        mesh->positions.resize(1);
    }
  }